

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zaxpy.c
# Opt level: O3

void zaxpy_(integer *n,doublecomplex *za,doublecomplex *zx,integer *incx,doublecomplex *zy,
           integer *incy)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  doublecomplex *pdVar13;
  doublecomplex *pdVar14;
  int iVar15;
  doublereal dVar16;
  
  if (0 < *n) {
    dVar16 = dcabs1_(za);
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      iVar5 = *incx;
      if ((long)iVar5 == 1) {
        iVar11 = *incy;
        uVar10 = (ulong)(uint)*n;
        lVar12 = 1;
        if (iVar11 == 1) {
          if (*n < 1) {
            return;
          }
          lVar12 = 0;
          do {
            dVar3 = za->r;
            dVar4 = za->i;
            pdVar1 = (double *)((long)&zx->r + lVar12);
            dVar6 = *pdVar1;
            dVar7 = pdVar1[1];
            pdVar1 = (double *)((long)&zy->r + lVar12);
            dVar8 = pdVar1[1];
            pdVar2 = (double *)((long)&zy->r + lVar12);
            *pdVar2 = *pdVar1 + dVar3 * dVar6 + dVar7 * -dVar4;
            pdVar2[1] = dVar8 + dVar3 * dVar7 + dVar6 * dVar4;
            lVar12 = lVar12 + 0x10;
          } while (uVar10 << 4 != lVar12);
          return;
        }
      }
      else {
        uVar10 = (ulong)(uint)*n;
        iVar11 = (1 - *n) * iVar5 + 1;
        if (-1 < iVar5) {
          iVar11 = 1;
        }
        lVar12 = (long)iVar11;
        iVar11 = *incy;
      }
      if (0 < (int)uVar10) {
        iVar15 = (1 - (int)uVar10) * iVar11 + 1;
        if (-1 < iVar11) {
          iVar15 = 1;
        }
        pdVar13 = zx + lVar12 + -1;
        pdVar14 = zy + (long)iVar15 + -1;
        do {
          dVar3 = za->r;
          dVar4 = za->i;
          dVar6 = pdVar13->r;
          dVar7 = pdVar13->i;
          pdVar14->r = pdVar14->r + dVar3 * dVar6 + dVar7 * -dVar4;
          pdVar14->i = pdVar14->i + dVar3 * dVar7 + dVar6 * dVar4;
          pdVar13 = pdVar13 + iVar5;
          pdVar14 = pdVar14 + iVar11;
          uVar9 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
    }
  }
  return;
}

Assistant:

void zaxpy_(integer *n, doublecomplex *za, doublecomplex *zx, 
	integer *incx, doublecomplex *zy, integer *incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2;

    /* Local variables */
    integer i;
    extern doublereal dcabs1_(doublecomplex *);
    integer ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   

    
   Parameter adjustments   
       Function Body */
#define ZY(I) zy[(I)-1]
#define ZX(I) zx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (dcabs1_(za) == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(ix).r - za->i * ZX(ix).i, z__2.i = za->r * ZX(
		ix).i + za->i * ZX(ix).r;
	z__1.r = ZY(iy).r + z__2.r, z__1.i = ZY(iy).i + z__2.i;
	ZY(iy).r = z__1.r, ZY(iy).i = z__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(i).r - za->i * ZX(i).i, z__2.i = za->r * ZX(
		i).i + za->i * ZX(i).r;
	z__1.r = ZY(i).r + z__2.r, z__1.i = ZY(i).i + z__2.i;
	ZY(i).r = z__1.r, ZY(i).i = z__1.i;
/* L30: */
    }
    return;
}